

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O2

void __thiscall QGenericUnixThemePrivate::QGenericUnixThemePrivate(QGenericUnixThemePrivate *this)

{
  char16_t **ppcVar1;
  uint *stream;
  int pointSize;
  qsizetype qVar2;
  QLoggingCategory *pQVar3;
  QDebug *pQVar4;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QArrayDataPointer<char16_t> local_80;
  char *local_68;
  QDebug local_60;
  QFont local_58;
  QFont local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformThemePrivate::QPlatformThemePrivate(&this->super_QPlatformThemePrivate);
  (this->super_QPlatformThemePrivate)._vptr_QPlatformThemePrivate =
       (_func_int **)&PTR__QGenericUnixThemePrivate_0078c868;
  qVar2 = QtPrivate::lengthHelperPointer<char>("Sans Serif");
  latin1.m_data = "Sans Serif";
  latin1.m_size = qVar2;
  QString::QString((QString *)&local_80,latin1);
  QFont::QFont(&this->systemFont,(QString *)&local_80,9,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  qVar2 = QtPrivate::lengthHelperPointer<char>("monospace");
  latin1_00.m_data = "monospace";
  latin1_00.m_size = qVar2;
  QString::QString((QString *)&local_80,latin1_00);
  pointSize = QFont::pointSize(&this->systemFont);
  QFont::QFont(&this->fixedFont,(QString *)&local_80,pointSize,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QFont::setStyleHint(&this->fixedFont,Courier,PreferDefault);
  pQVar3 = QtPrivateLogging::lcQpaFonts();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_68 = pQVar3->name;
    local_80.d._0_4_ = 2;
    local_80._4_8_ = 0;
    local_80._12_8_ = 0;
    local_80.size._4_4_ = 0;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_60,"default fonts: system");
    local_58.d.d.ptr = (totally_ordered_wrapper<QFontPrivate_*>)pQVar4->stream;
    ppcVar1 = &(((QFontPrivate *)local_58.d.d.ptr)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    stream = &local_58.resolve_mask;
    ::operator<<((QDebug)stream,&local_58);
    pQVar4 = QDebug::operator<<((QDebug *)stream,"fixed");
    local_48.d.d.ptr = (totally_ordered_wrapper<QFontPrivate_*>)pQVar4->stream;
    ppcVar1 = &(((QFontPrivate *)local_48.d.d.ptr)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((QDebug)&local_48.resolve_mask,&local_48);
    QDebug::~QDebug((QDebug *)&local_48.resolve_mask);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug((QDebug *)stream);
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGenericUnixThemePrivate::QGenericUnixThemePrivate()
    : QPlatformThemePrivate()
    , systemFont(QLatin1StringView(QGenericUnixTheme::defaultSystemFontNameC),
                 QGenericUnixTheme::defaultSystemFontSize)
    , fixedFont(QLatin1StringView(QGenericUnixTheme::defaultFixedFontNameC),
                systemFont.pointSize())
{
    fixedFont.setStyleHint(QFont::TypeWriter);
    qCDebug(lcQpaFonts) << "default fonts: system" << systemFont << "fixed" << fixedFont;
}